

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad.c
# Opt level: O1

uint aom_highbd_sad128x64_c(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar21;
  uint uVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  lVar11 = (long)ref * 2;
  lVar12 = (long)src * 2;
  uVar14 = 0;
  iVar13 = 0;
  do {
    iVar15 = 0;
    iVar16 = 0;
    iVar17 = 0;
    lVar10 = 0;
    do {
      uVar1 = *(ulong *)(lVar12 + lVar10 * 2);
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar1;
      auVar2._12_2_ = (short)(uVar1 >> 0x30);
      auVar4._8_2_ = (short)(uVar1 >> 0x20);
      auVar4._0_8_ = uVar1;
      auVar4._10_4_ = auVar2._10_4_;
      auVar8._6_8_ = 0;
      auVar8._0_6_ = auVar4._8_6_;
      auVar6._4_2_ = (short)(uVar1 >> 0x10);
      auVar6._0_4_ = (uint)uVar1;
      auVar6._6_8_ = SUB148(auVar8 << 0x40,6);
      auVar19._0_4_ = (uint)uVar1 & 0xffff;
      auVar19._4_10_ = auVar6._4_10_;
      auVar19._14_2_ = 0;
      uVar1 = *(ulong *)(lVar11 + lVar10 * 2);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3._12_2_ = (short)(uVar1 >> 0x30);
      auVar5._8_2_ = (short)(uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._10_4_ = auVar3._10_4_;
      auVar9._6_8_ = 0;
      auVar9._0_6_ = auVar5._8_6_;
      auVar7._4_2_ = (short)(uVar1 >> 0x10);
      auVar7._0_4_ = (uint)uVar1;
      auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
      auVar24._0_4_ = (uint)uVar1 & 0xffff;
      auVar24._4_10_ = auVar7._4_10_;
      auVar24._14_2_ = 0;
      auVar25 = auVar24 | _DAT_004d2ad0;
      auVar20 = auVar19 | _DAT_004d2ad0;
      uVar18 = -(uint)(auVar25._0_4_ < auVar20._0_4_);
      uVar21 = -(uint)(auVar25._4_4_ < auVar20._4_4_);
      uVar22 = -(uint)(auVar25._8_4_ < auVar20._8_4_);
      uVar23 = -(uint)(auVar25._12_4_ < auVar20._12_4_);
      uVar14 = uVar14 + (uVar18 - (auVar19._0_4_ - auVar24._0_4_ ^ uVar18));
      iVar15 = iVar15 + (uVar21 - (auVar6._4_4_ - auVar7._4_4_ ^ uVar21));
      iVar16 = iVar16 + (uVar22 - (auVar4._8_4_ - auVar5._8_4_ ^ uVar22));
      iVar17 = iVar17 + (uVar23 - ((auVar2._10_4_ >> 0x10) - (auVar3._10_4_ >> 0x10) ^ uVar23));
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0x80);
    uVar14 = iVar17 + iVar15 + iVar16 + uVar14;
    iVar13 = iVar13 + 1;
    lVar12 = lVar12 + (long)src_stride * 2;
    lVar11 = lVar11 + (long)ref_stride * 2;
  } while (iVar13 != 0x40);
  return uVar14;
}

Assistant:

static inline unsigned int highbd_sad(const uint8_t *a8, int a_stride,
                                      const uint8_t *b8, int b_stride,
                                      int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      sad += abs(a[x] - b[x]);
    }

    a += a_stride;
    b += b_stride;
  }
  return sad;
}